

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::DeleteItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          PropertyOperationFlags propertyOperationFlags)

{
  PropertyOperationFlags PVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  BOOL BVar5;
  IndexPropertyDescriptorMap *this_00;
  ScriptContext *pSVar6;
  ScriptContext *pSVar7;
  JavascriptString *pJVar8;
  char16 *pcVar9;
  nullptr_t local_48;
  nullptr_t local_40;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  PropertyOperationFlags propertyOperationFlags_local;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  descriptor._0_4_ = propertyOperationFlags;
  descriptor._4_4_ = index;
  _propertyOperationFlags_local = instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                      (&this->indexPropertyMap);
  bVar3 = IndexPropertyDescriptorMap::TryGetReference(this_00,descriptor._4_4_,&local_38);
  PVar1 = (PropertyOperationFlags)descriptor;
  if (bVar3) {
    if ((local_38->Attributes & 8) == 0) {
      if ((local_38->Attributes & 2) == 0) {
        pSVar6 = RecyclableObject::GetScriptContext
                           (&_propertyOperationFlags_local->super_RecyclableObject);
        uVar2 = descriptor._4_4_;
        pSVar7 = RecyclableObject::GetScriptContext
                           (&_propertyOperationFlags_local->super_RecyclableObject);
        pJVar8 = TaggedInt::ToString(uVar2,pSVar7);
        pcVar9 = JavascriptString::GetString(pJVar8);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(PVar1,pSVar6,pcVar9);
        this_local._4_4_ = 0;
      }
      else {
        Js::JavascriptArray::DirectDeleteItemAt<void*>
                  ((JavascriptArray *)instance_local,descriptor._4_4_);
        local_40 = (nullptr_t)0x0;
        Memory::WriteBarrierPtr<void>::operator=(&local_38->Getter,&local_40);
        local_48 = (nullptr_t)0x0;
        Memory::WriteBarrierPtr<void>::operator=(&local_38->Setter,&local_48);
        local_38->Attributes = '\x0e';
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    bVar4 = GetDataItemAttributes(this);
    if ((bVar4 & 2) == 0) {
      BVar5 = HasDataItem(this,(ES5Array *)instance_local,descriptor._4_4_);
      PVar1 = (PropertyOperationFlags)descriptor;
      if (BVar5 == 0) {
        this_local._4_4_ = 1;
      }
      else {
        pSVar6 = RecyclableObject::GetScriptContext
                           (&_propertyOperationFlags_local->super_RecyclableObject);
        uVar2 = descriptor._4_4_;
        pSVar7 = RecyclableObject::GetScriptContext
                           (&_propertyOperationFlags_local->super_RecyclableObject);
        pJVar8 = TaggedInt::ToString(uVar2,pSVar7);
        pcVar9 = JavascriptString::GetString(pJVar8);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(PVar1,pSVar6,pcVar9);
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ =
           Js::JavascriptArray::DirectDeleteItemAt<void*>
                     ((JavascriptArray *)instance_local,descriptor._4_4_);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::DeleteItem(ES5Array* arr, DynamicObject* instance, uint32 index, PropertyOperationFlags propertyOperationFlags)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }

            arr->DirectDeleteItemAt<Var>(index);
            descriptor->Getter = nullptr;
            descriptor->Setter = nullptr;
            descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            return true;
        }

        // Not in attribute map
        if (!(GetDataItemAttributes() & PropertyConfigurable))
        {
            if (HasDataItem(arr, index))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }
            return true; // non-existing non-configurable property can be deleted
        }
        return arr->DirectDeleteItemAt<Var>(index);
    }